

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# srho.hpp
# Opt level: O0

double wdm::impl::srho(vector<double,_std::allocator<double>_> *x,
                      vector<double,_std::allocator<double>_> *y,
                      vector<double,_std::allocator<double>_> *weights)

{
  vector<double,_std::allocator<double>_> *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  double dVar1;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe78;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe80;
  allocator *paVar2;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe90;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffeb8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffec0;
  allocator local_101;
  string local_100 [80];
  vector<double,_std::allocator<double>_> local_b0;
  allocator local_91;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff70;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff78;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff98;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffa0;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffa8;
  
  utils::check_sizes(in_RDI,in_RSI,in_stack_fffffffffffffe90);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  paVar2 = &local_91;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffff70,"average",paVar2);
  rank0(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::vector<double,_std::allocator<double>_>::operator=
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffe80);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffe80);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffe80);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  paVar2 = &local_101;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"average",paVar2);
  rank0(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)paVar2,&local_b0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)paVar2);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)paVar2);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)paVar2);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  dVar1 = prho(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)paVar2);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)paVar2);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)paVar2);
  return dVar1;
}

Assistant:

inline double srho(std::vector<double> x,
                   std::vector<double> y,
                   std::vector<double> weights = std::vector<double>())
{
    utils::check_sizes(x, y, weights);
    x = rank0(x, weights, "average");
    y = rank0(y, weights, "average");
    return prho(x, y, weights);
}